

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O3

bool EthBasePort::CheckDebugHeader(ostream *debugStream,string *caller,char *header,uint version)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  char local_1b;
  char local_1a;
  char local_19;
  
  if (((*header == 'D') && (header[1] == 'B')) && (header[2] == 'G')) {
    if (header[3] == 0x30) {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (debugStream,(caller->_M_dataplus)._M_p,caller->_M_string_length);
      pcVar3 = ": No debug data available";
      lVar2 = 0x19;
    }
    else {
      if ((int)header[3] - 0x30U == version) {
        return true;
      }
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (debugStream,(caller->_M_dataplus)._M_p,caller->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,": Unsupported debug level: ",0x1b);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," (must be ",10);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      pcVar3 = ")";
      lVar2 = 1;
    }
  }
  else {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (debugStream,(caller->_M_dataplus)._M_p,caller->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,": Unexpected header string: ",0x1c);
    local_1b = *header;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1b,1);
    local_1a = header[1];
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1a,1);
    local_19 = header[2];
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_19,1);
    pcVar3 = " (should be DBG)";
    lVar2 = 0x10;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return false;
}

Assistant:

bool EthBasePort::CheckDebugHeader(std::ostream &debugStream, const std::string &caller, const char *header,
                                   unsigned int version)
{
    if (strncmp(header, "DBG", 3) != 0) {
        debugStream << caller << ": Unexpected header string: " << header[0] << header[1]
                    << header[2] << " (should be DBG)" << std::endl;
        return false;
    }
    unsigned int debugLevel = header[3] - '0';
    if (debugLevel == 0) {
        debugStream << caller << ": No debug data available" << std::endl;
        return false;
    }
    // Introduced debugLevel 2 with Firmware V8. Use an older version of this software for
    // earlier versions of firmware.
    else if (debugLevel != version) {
        debugStream << caller << ": Unsupported debug level: " << debugLevel << " (must be "
                    << version << ")" << std::endl;
        return false;
    }
    return true;
}